

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

int mg_strcasecmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  __int32_t **pp_Var3;
  long lVar4;
  
  pp_Var3 = __ctype_tolower_loc();
  lVar4 = 0;
  do {
    iVar1 = (*pp_Var3)[(byte)s1[lVar4]];
    iVar2 = (*pp_Var3)[(byte)s2[lVar4]];
    if (s1[lVar4] == 0) break;
    lVar4 = lVar4 + 1;
  } while (iVar1 == iVar2);
  return iVar1 - iVar2;
}

Assistant:

CIVETWEB_API int
mg_strcasecmp(const char *s1, const char *s2)
{
	int diff;

	do {
		diff = lowercase(s1++) - lowercase(s2++);
	} while (diff == 0 && s1[-1] != '\0');

	return diff;
}